

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

int lencode_order(lua_State *L)

{
  uint uVar1;
  int iVar2;
  char *key;
  void *__dest;
  int iVar3;
  size_t local_88;
  bson b;
  
  b.ptr = b.buffer;
  b.size = 0;
  b.cap = 0x40;
  uVar1 = lua_gettop(L);
  if ((uVar1 & 1) == 0) {
    iVar2 = reserve_length(&b);
    for (iVar3 = 2; iVar3 + -2 < (int)uVar1; iVar3 = iVar3 + 2) {
      key = lua_tolstring(L,iVar3 - 1U,&local_88);
      if (key == (char *)0x0) {
        luaL_error(L,"Argument %d need a string",(ulong)(iVar3 - 1U));
      }
      lua_pushvalue(L,iVar3);
      append_one(&b,L,key,local_88);
      lua_settop(L,-2);
    }
    write_byte(&b,'\0');
    iVar3 = b.size - iVar2;
    b.ptr[iVar2] = (uint8_t)iVar3;
    b.ptr[(long)iVar2 + 1] = (uint8_t)((uint)iVar3 >> 8);
    b.ptr[(long)iVar2 + 2] = (uint8_t)((uint)iVar3 >> 0x10);
    b.ptr[(long)iVar2 + 3] = (uint8_t)((uint)iVar3 >> 0x18);
    iVar3 = 1;
    lua_settop(L,1);
    __dest = lua_newuserdata(L,(long)b.size);
    memcpy(__dest,b.ptr,(long)b.size);
    bson_destroy(&b);
    bson_meta(L);
  }
  else {
    iVar3 = luaL_error(L,"Invalid ordered dict");
  }
  return iVar3;
}

Assistant:

static int
lencode_order(lua_State *L) {
	struct bson b;
	bson_create(&b);
	int n = lua_gettop(L);
	if (n%2 != 0) {
		return luaL_error(L, "Invalid ordered dict");
	}
	pack_ordered_dict(L, &b, n);
	lua_settop(L,1);
	void * ud = lua_newuserdata(L, b.size);
	memcpy(ud, b.ptr, b.size);
	bson_destroy(&b);
	bson_meta(L);
	return 1;
}